

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectPivots(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *threshold)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined1 (*pauVar3) [16];
  pointer pnVar4;
  undefined8 uVar5;
  Pring *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  Pring *pPVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  Pring *pPVar18;
  int *piVar19;
  long lVar20;
  Pring *pPVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  type t;
  int local_140;
  int local_13c;
  cpp_dec_float<50U,_int,_void> local_138;
  int local_100;
  int local_fc;
  cpp_dec_float<50U,_int,_void> local_f8;
  long local_b8;
  ulong local_b0;
  cpp_dec_float<50u,int,void> local_a8 [8];
  uint auStack_a0 [2];
  uint local_98 [2];
  undefined5 uStack_90;
  undefined3 uStack_8b;
  uint local_88 [3];
  byte local_7c;
  undefined8 local_78;
  long local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  cpp_dec_float<50U,_int,_void> *local_58;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_50;
  Pring *local_48;
  ulong local_40;
  long local_38;
  
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  _local_a8 = (undefined1  [16])0x0;
  local_98[0] = 0;
  local_98[1] = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_7c = 0;
  local_58 = &threshold->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_a8,0.0);
  iVar11 = ~(this->temp).stage + this->thedim;
  local_68 = 4;
  if (iVar11 < 4) {
    local_68 = iVar11;
  }
  local_48 = &(this->temp).pivots;
  local_40 = 0;
  local_b0 = 2;
  local_100 = -1;
  local_fc = -1;
  local_140 = -1;
  local_50 = this;
LAB_0027e7bc:
  pPVar14 = (this->temp).pivot_rowNZ;
  iVar11 = (int)local_b0;
  pPVar21 = pPVar14[iVar11].next;
  pPVar14 = pPVar14 + iVar11;
  if (pPVar21 == pPVar14) {
    pPVar18 = (this->temp).pivot_colNZ + iVar11;
    do {
      if (pPVar18 != pPVar18->next) {
        local_140 = pPVar18->next->idx;
        iVar11 = (this->temp).s_cact[local_140];
        iVar12 = this->thedim + 1;
        if (iVar11 < 1) goto LAB_0027f2a0;
        local_64 = (int)local_b0 + 1;
        iVar17 = (this->u).col.len[local_140] + (this->u).col.start[local_140] + -1;
        lVar20 = (long)iVar17;
        lVar22 = (long)(iVar17 - iVar11);
        local_13c = -1;
        local_70 = lVar22;
        goto LAB_0027ec9d;
      }
      pPVar21 = pPVar14[1].next;
      pPVar14 = pPVar14 + 1;
      local_b0 = (ulong)((int)local_b0 + 1);
      pPVar18 = pPVar18 + 1;
    } while (pPVar14 == pPVar21);
  }
  iVar11 = pPVar21->idx;
  iVar12 = (this->u).row.start[iVar11];
  local_b8 = (long)iVar12;
  iVar17 = (this->u).row.len[iVar11];
  iVar26 = iVar12 + iVar17 + -1;
  pnVar4 = (this->temp).s_max.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((long)pnVar4[iVar11].m_backend.data._M_elems + 0x20);
  local_f8.data._M_elems[8] = (uint)uVar5;
  local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)pnVar4[iVar11].m_backend.data._M_elems;
  uVar7 = *(undefined8 *)((long)pnVar4[iVar11].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar4[iVar11].m_backend.data._M_elems + 0x10);
  uVar8 = *(undefined8 *)puVar2;
  uVar9 = *(undefined8 *)(puVar2 + 2);
  local_f8.data._M_elems[4] = (uint)uVar8;
  local_f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
  local_f8.data._M_elems[6] = (uint)uVar9;
  local_f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
  local_f8.data._M_elems[0] = (uint)uVar5;
  local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
  local_f8.data._M_elems[2] = (uint)uVar7;
  local_f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
  local_f8.exp = pnVar4[iVar11].m_backend.exp;
  local_f8.neg = pnVar4[iVar11].m_backend.neg;
  local_f8.fpclass = pnVar4[iVar11].m_backend.fpclass;
  local_f8.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
  local_fc = iVar11;
  if (local_f8.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_138,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_f8,&local_138);
    if (iVar12 < 0) {
      pnVar4 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_f8.data._M_elems[0] = pnVar4[iVar26].m_backend.data._M_elems[0];
      local_f8.data._M_elems[9] = *(uint *)((long)pnVar4[iVar26].m_backend.data._M_elems + 0x24);
      local_138.data._M_elems[8] = local_f8.data._M_elems[9];
      puVar2 = (uint *)((long)pnVar4[iVar26].m_backend.data._M_elems + 0x14);
      local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar4[iVar26].m_backend.data._M_elems + 4);
      local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      local_f8.neg = pnVar4[iVar26].m_backend.neg;
      local_f8.fpclass = pnVar4[iVar26].m_backend.fpclass;
      local_f8.prec_elem = pnVar4[iVar26].m_backend.prec_elem;
      if (local_f8.neg == true) {
        local_f8.neg = local_f8.fpclass == cpp_dec_float_finite && local_f8.data._M_elems[0] == 0;
      }
      local_f8.exp = pnVar4[iVar26].m_backend.exp;
      local_f8.data._M_elems[5] = local_138.data._M_elems[4];
      local_f8.data._M_elems[6] = local_138.data._M_elems[5];
      local_f8.data._M_elems[7] = local_138.data._M_elems[6];
      local_f8.data._M_elems[8] = local_138.data._M_elems[7];
      local_f8.data._M_elems[1] = local_138.data._M_elems[0];
      local_f8.data._M_elems[2] = local_138.data._M_elems[1];
      local_f8.data._M_elems[3] = local_138.data._M_elems[2];
      local_f8.data._M_elems[4] = local_138.data._M_elems[3];
      iVar12 = (int)local_b8 + iVar17 + -2;
      if ((int)local_b8 <= iVar12) {
        lVar24 = (long)iVar12 + 1;
        lVar22 = (long)iVar12 * 0x38 + 0x30;
        lVar20 = local_b8;
        do {
          pnVar4 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -8);
          local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -4);
          local_138._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar22);
          puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x30);
          local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x20);
          local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_138.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x10);
          if ((local_138.neg == true) &&
             (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)) {
            local_138.neg = false;
          }
          if (((local_f8.fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN))
             && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_f8,&local_138), lVar20 = local_b8, iVar12 < 0)) {
            pnVar4 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_f8.data._M_elems[0] =
                 *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x30);
            local_f8.data._M_elems[9] =
                 *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0xc);
            local_138.data._M_elems[8] = local_f8.data._M_elems[9];
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x1c);
            local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -0x2c);
            local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -4);
            local_f8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar22);
            if (local_f8.neg == true) {
              local_f8.neg = local_f8.fpclass == cpp_dec_float_finite &&
                             local_f8.data._M_elems[0] == 0;
            }
            local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar22 + -8);
            local_f8.data._M_elems[5] = local_138.data._M_elems[4];
            local_f8.data._M_elems[6] = local_138.data._M_elems[5];
            local_f8.data._M_elems[7] = local_138.data._M_elems[6];
            local_f8.data._M_elems[8] = local_138.data._M_elems[7];
            local_f8.data._M_elems[1] = local_138.data._M_elems[0];
            local_f8.data._M_elems[2] = local_138.data._M_elems[1];
            local_f8.data._M_elems[3] = local_138.data._M_elems[2];
            local_f8.data._M_elems[4] = local_138.data._M_elems[3];
          }
          lVar24 = lVar24 + -1;
          lVar22 = lVar22 + -0x38;
        } while (lVar20 < lVar24);
      }
      pnVar4 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar4[iVar11].m_backend.data._M_elems + 0x20) =
           CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
      puVar2 = (uint *)((long)pnVar4[iVar11].m_backend.data._M_elems + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
      *(ulong *)pnVar4[iVar11].m_backend.data._M_elems =
           CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
      *(ulong *)((long)pnVar4[iVar11].m_backend.data._M_elems + 8) =
           CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
      pnVar4[iVar11].m_backend.exp = local_f8.exp;
      pnVar4[iVar11].m_backend.neg = local_f8.neg;
      pnVar4[iVar11].m_backend.fpclass = local_f8.fpclass;
      pnVar4[iVar11].m_backend.prec_elem = local_f8.prec_elem;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,local_58);
  iVar12 = this->thedim + 1;
  if (iVar17 < 1) {
LAB_0027f2a0:
    local_13c = -1;
  }
  else {
    lVar20 = (long)iVar26 + 1;
    lVar24 = (long)iVar26 * 0xe + 0xd;
    local_13c = -1;
    lVar22 = local_b8;
    do {
      pnVar4 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (this->u).row.idx[lVar20 + -1];
      iVar17 = (this->temp).s_cact[iVar11];
      local_88._0_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -0x14)
      ;
      pauVar3 = (undefined1 (*) [16])((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -0x34);
      uVar5 = *(undefined8 *)*pauVar3;
      uVar7 = *(undefined8 *)(*pauVar3 + 8);
      _local_a8 = *pauVar3;
      puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -0x24);
      local_98 = *(uint (*) [2])puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      uStack_90 = (undefined5)uVar8;
      uStack_8b = SUB83(uVar8,5);
      local_88[2] = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -0xc);
      local_7c = *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -8);
      local_78._0_4_ = *(fpclass_type *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4 + -4);
      local_78._4_4_ = *(int32_t *)((long)(pnVar4->m_backend).data._M_elems + lVar24 * 4);
      if (iVar17 < iVar12) {
        local_138.prec_elem = local_78._4_4_;
        local_138.fpclass = (fpclass_type)local_78;
        local_138.neg = (bool)local_7c;
        if ((local_7c != 0) &&
           (local_138.data._M_elems[0] = (uint)uVar5,
           local_138.data._M_elems[0] != 0 || (fpclass_type)local_78 != cpp_dec_float_finite)) {
          local_138.neg = (bool)(local_7c ^ 1);
        }
        this = local_50;
        local_138.data._M_elems._0_8_ = uVar5;
        local_138.data._M_elems._8_8_ = uVar7;
        local_138.data._M_elems._16_8_ = local_98;
        local_138.data._M_elems._24_8_ = uVar8;
        local_138.data._M_elems._32_8_ = local_88._0_8_;
        local_138.exp = local_88[2];
        if (((((fpclass_type)local_78 != cpp_dec_float_NaN) &&
             (local_f8.fpclass != cpp_dec_float_NaN)) &&
            (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_138,&local_f8), lVar22 = local_b8, this = local_50,
            0 < iVar13)) &&
           (local_13c = iVar26, iVar12 = iVar17, local_140 = iVar11, iVar17 <= (int)local_b0))
        break;
      }
      lVar20 = lVar20 + -1;
      lVar24 = lVar24 + -0xe;
      iVar26 = iVar26 + -1;
    } while (lVar22 < lVar20);
  }
  goto LAB_0027f2a8;
LAB_0027ec9d:
  do {
    iVar11 = (this->u).col.idx[lVar20];
    lVar24 = (long)iVar11;
    iVar17 = (this->u).row.len[lVar24];
    if (iVar17 < iVar12) {
      pnVar4 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = lVar24 * 0x38;
      local_60 = iVar17;
      local_5c = iVar11;
      if (pnVar4[lVar24].m_backend.fpclass == cpp_dec_float_NaN) {
        piVar19 = (this->u).row.start;
LAB_0027ee0e:
        iVar11 = piVar19[lVar24];
        lVar22 = (long)iVar11;
        pnVar4 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f8.data._M_elems[0] = pnVar4[lVar22].m_backend.data._M_elems[0];
        local_f8.data._M_elems[9] = *(uint *)((long)pnVar4[lVar22].m_backend.data._M_elems + 0x24);
        local_138.data._M_elems[8] = local_f8.data._M_elems[9];
        puVar2 = (uint *)((long)pnVar4[lVar22].m_backend.data._M_elems + 0x14);
        local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)pnVar4[lVar22].m_backend.data._M_elems + 4);
        local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        local_f8.neg = pnVar4[lVar22].m_backend.neg;
        local_f8.fpclass = pnVar4[lVar22].m_backend.fpclass;
        local_f8.prec_elem = pnVar4[lVar22].m_backend.prec_elem;
        if (local_f8.neg == true) {
          local_f8.neg = local_f8.fpclass == cpp_dec_float_finite && local_f8.data._M_elems[0] == 0;
        }
        local_f8.exp = pnVar4[lVar22].m_backend.exp;
        local_f8.data._M_elems[5] = local_138.data._M_elems[4];
        local_f8.data._M_elems[6] = local_138.data._M_elems[5];
        local_f8.data._M_elems[7] = local_138.data._M_elems[6];
        local_f8.data._M_elems[8] = local_138.data._M_elems[7];
        local_f8.data._M_elems[1] = local_138.data._M_elems[0];
        local_f8.data._M_elems[2] = local_138.data._M_elems[1];
        local_f8.data._M_elems[3] = local_138.data._M_elems[2];
        local_f8.data._M_elems[4] = local_138.data._M_elems[3];
        lVar24 = (long)((this->u).row.len[lVar24] + iVar11);
        lVar27 = lVar24 << 0x20;
        lVar15 = lVar24 * 0x38;
        local_38 = lVar20;
        do {
          lVar20 = lVar15;
          lVar23 = lVar27;
          lVar16 = lVar24;
          if (lVar16 <= lVar22) goto LAB_0027f03c;
          pnVar4 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x10);
          local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0xc);
          local_138._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -8);
          puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar20);
          local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(&(pnVar4->m_backend).data + 0xffffffffffffffff) + lVar20);
          local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_138.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x18);
          if ((local_138.neg == true) &&
             (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)) {
            local_138.neg = false;
          }
          if (((local_f8.fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN))
             && (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_f8,&local_138), iVar17 < 0)) {
            pnVar4 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_f8.data._M_elems[0] = *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar20)
            ;
            local_f8.data._M_elems[9] =
                 *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x14);
            local_138.data._M_elems[8] = local_f8.data._M_elems[9];
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x24);
            local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x34);
            local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0xc);
            local_f8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -8)
            ;
            if (local_f8.neg == true) {
              local_f8.neg = local_f8.fpclass == cpp_dec_float_finite &&
                             local_f8.data._M_elems[0] == 0;
            }
            local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar20 + -0x10);
            local_f8.data._M_elems[5] = local_138.data._M_elems[4];
            local_f8.data._M_elems[6] = local_138.data._M_elems[5];
            local_f8.data._M_elems[7] = local_138.data._M_elems[6];
            local_f8.data._M_elems[8] = local_138.data._M_elems[7];
            local_f8.data._M_elems[1] = local_138.data._M_elems[0];
            local_f8.data._M_elems[2] = local_138.data._M_elems[1];
            local_f8.data._M_elems[3] = local_138.data._M_elems[2];
            local_f8.data._M_elems[4] = local_138.data._M_elems[3];
          }
          lVar24 = lVar16 + -1;
          lVar27 = lVar23 + -0x100000000;
          lVar15 = lVar20 + -0x38;
        } while ((this->u).row.idx[lVar16 + -1] != local_140);
        pnVar4 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88._0_8_ = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar20 + 0x20);
        _local_a8 = *(undefined1 (*) [16])((long)pnVar4[-1].m_backend.data._M_elems + lVar20);
        puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar20 + 0x10);
        local_98 = *(uint (*) [2])puVar2;
        uVar5 = *(undefined8 *)(puVar2 + 2);
        uStack_90 = (undefined5)uVar5;
        uStack_8b = (undefined3)((ulong)uVar5 >> 0x28);
        local_88[2] = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar20);
        local_7c = *(byte *)((long)(&pnVar4[-1].m_backend.data + 1) + 4U + lVar20);
        local_78 = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + 8U + lVar20);
        local_100 = (int)(lVar16 + -1);
LAB_0027f03c:
        lVar20 = local_38;
        if (iVar11 < (int)lVar16 + -2) {
          lVar23 = lVar23 >> 0x20;
          lVar24 = lVar23 + -2;
          lVar27 = lVar23 * 0x38 + -0x40;
          do {
            pnVar4 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -8);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -4);
            local_138._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar27);
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x30);
            local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x20);
            local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_138.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x10);
            if ((local_138.neg == true) &&
               (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)) {
              local_138.neg = false;
            }
            if (((local_f8.fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)
                ) && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_f8,&local_138), iVar11 < 0)) {
              pnVar4 = (this->u).row.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_f8.data._M_elems[0] =
                   *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x30);
              local_f8.data._M_elems[9] =
                   *(uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0xc);
              local_138.data._M_elems[8] = local_f8.data._M_elems[9];
              puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x1c);
              local_138.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -0x2c);
              local_138.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_138.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              local_f8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -4);
              local_f8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar27);
              if (local_f8.neg == true) {
                local_f8.neg = local_f8.fpclass == cpp_dec_float_finite &&
                               local_f8.data._M_elems[0] == 0;
              }
              local_f8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar27 + -8);
              local_f8.data._M_elems[5] = local_138.data._M_elems[4];
              local_f8.data._M_elems[6] = local_138.data._M_elems[5];
              local_f8.data._M_elems[7] = local_138.data._M_elems[6];
              local_f8.data._M_elems[8] = local_138.data._M_elems[7];
              local_f8.data._M_elems[1] = local_138.data._M_elems[0];
              local_f8.data._M_elems[2] = local_138.data._M_elems[1];
              local_f8.data._M_elems[3] = local_138.data._M_elems[2];
              local_f8.data._M_elems[4] = local_138.data._M_elems[3];
            }
            lVar24 = lVar24 + -1;
            lVar27 = lVar27 + -0x38;
          } while (lVar22 < lVar24);
        }
        pnVar4 = (this->temp).s_max.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)(pnVar4->m_backend).data._M_elems + local_b8 + 0x20) =
             CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
        puVar1 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_b8 + 0x10);
        *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
        puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
        puVar1 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_b8);
        *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
        puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
        *(int *)((long)(&(pnVar4->m_backend).data + 1) + local_b8) = local_f8.exp;
        *(bool *)((long)(&(pnVar4->m_backend).data + 1) + 4U + local_b8) = local_f8.neg;
        *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + 8U + local_b8) = local_f8._48_8_;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_138,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar4[lVar24].m_backend,&local_138);
        piVar19 = (this->u).row.start;
        if (iVar11 < 1) goto LAB_0027ee0e;
        lVar27 = (long)((this->u).row.len[lVar24] + piVar19[lVar24]);
        lVar22 = lVar27 * 0xe + 0xc;
        do {
          lVar15 = lVar22;
          if (lVar27 <= piVar19[lVar24]) goto LAB_0027edc0;
          lVar16 = lVar27 + -1;
          lVar23 = lVar27 + -1;
          lVar22 = lVar15 + -0xe;
          lVar27 = lVar16;
        } while ((this->u).row.idx[lVar23] != local_140);
        pnVar4 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88._0_8_ = *(undefined8 *)((long)(&pnVar4[-2].m_backend.data + 1) + lVar15 * 4);
        _local_a8 = *(undefined1 (*) [16])
                     ((long)pnVar4[-2].m_backend.data._M_elems + lVar15 * 4 + 8);
        puVar2 = (uint *)((long)pnVar4[-2].m_backend.data._M_elems + lVar15 * 4 + 0x18);
        local_98 = *(uint (*) [2])puVar2;
        uVar5 = *(undefined8 *)(puVar2 + 2);
        uStack_90 = (undefined5)uVar5;
        uStack_8b = (undefined3)((ulong)uVar5 >> 0x28);
        local_88[2] = *(int *)((long)(&pnVar4[-2].m_backend.data + 1) + 8U + lVar15 * 4);
        local_7c = *(byte *)((long)(&pnVar4[-2].m_backend.data + 1) + 0xcU + lVar15 * 4);
        local_78 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar15 * 4);
        local_100 = (int)lVar16;
LAB_0027edc0:
        pnVar4 = (this->temp).s_max.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_b8 + 0x20);
        local_f8.data._M_elems[8] = (uint)uVar5;
        local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        puVar1 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_b8);
        uVar5 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_b8 + 0x10);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        local_f8.data._M_elems[4] = (uint)uVar8;
        local_f8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
        local_f8.data._M_elems[6] = (uint)uVar9;
        local_f8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
        local_f8.data._M_elems[0] = (uint)uVar5;
        local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_f8.data._M_elems[2] = (uint)uVar7;
        local_f8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
        local_f8.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + local_b8);
        local_f8.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + 4U + local_b8);
        local_f8._48_8_ = *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + 8U + local_b8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,local_58)
      ;
      auVar10 = _local_a8;
      local_138.data._M_elems[8] = local_88[0];
      local_138.data._M_elems[9] = local_88[1];
      local_138.data._M_elems[7]._1_3_ = uStack_8b;
      local_138.data._M_elems._24_5_ = uStack_90;
      local_138.data._M_elems[4] = local_98[0];
      local_138.data._M_elems[5] = local_98[1];
      local_138.data._M_elems._0_8_ = local_a8;
      uVar5 = local_138.data._M_elems._0_8_;
      local_138.data._M_elems[2] = auStack_a0[0];
      local_138.data._M_elems[3] = auStack_a0[1];
      local_138.exp = local_88[2];
      local_138.neg = (bool)local_7c;
      local_138.fpclass = (fpclass_type)local_78;
      local_138.prec_elem = local_78._4_4_;
      if ((local_7c == 1) &&
         (local_138.data._M_elems[0] = auVar10._0_4_,
         local_138.data._M_elems[0] != 0 || (fpclass_type)local_78 != cpp_dec_float_finite)) {
        local_138.neg = false;
      }
      lVar22 = local_70;
      local_138.data._M_elems._0_8_ = uVar5;
      _local_a8 = auVar10;
      if ((((fpclass_type)local_78 != cpp_dec_float_NaN) && (local_f8.fpclass != cpp_dec_float_NaN))
         && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_138,&local_f8), lVar22 = local_70, 0 < iVar11)) {
        local_fc = local_5c;
        local_13c = local_100;
        iVar12 = local_60;
        if (local_60 <= local_64) break;
      }
    }
    lVar20 = lVar20 + -1;
  } while (lVar22 < lVar20);
LAB_0027f2a8:
  pPVar14 = (this->temp).pivot_col;
  lVar20 = (long)local_140;
  pPVar21 = pPVar14[lVar20].next;
  pPVar18 = pPVar14[lVar20].prev;
  pPVar21->prev = pPVar18;
  pPVar18->next = pPVar21;
  pPVar14[lVar20].next = pPVar14 + lVar20;
  pPVar14[lVar20].prev = pPVar14 + lVar20;
  if (-1 < local_13c) {
    lVar20 = (long)local_fc;
    pPVar14 = (this->temp).pivot_row;
    pPVar14[lVar20].pos = local_13c - (this->u).row.start[lVar20];
    iVar11 = ((int)local_b0 + -1) * (iVar12 + -1);
    pPVar14[lVar20].mkwtz = iVar11;
    pPVar21 = local_48;
    do {
      pPVar21 = pPVar21->next;
      if ((pPVar21->idx < 0) || (pPVar21->idx == local_fc)) break;
    } while (pPVar21->mkwtz < iVar11);
    pPVar21 = pPVar21->prev;
    if (pPVar21->idx != local_fc) {
      pPVar18 = pPVar14[lVar20].next;
      pPVar6 = pPVar14[lVar20].prev;
      pPVar18->prev = pPVar6;
      pPVar6->next = pPVar18;
      pPVar18 = pPVar21->next;
      pPVar14[lVar20].next = pPVar18;
      pPVar18->prev = pPVar14 + lVar20;
      pPVar14[lVar20].prev = pPVar21;
      pPVar21->next = pPVar14 + lVar20;
    }
    uVar25 = (int)local_40 + 1;
    local_40 = (ulong)uVar25;
    if (local_68 <= (int)uVar25) {
      return;
    }
  }
  goto LAB_0027e7bc;
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}